

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::TemplatedDecimalScaleDown<short,duckdb::hugeint_t,duckdb::NumericHelper>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  DecimalScaleInput<short,_short> input;
  Vector *local_58;
  Vector *local_50;
  CastParameters *local_48;
  undefined1 local_40;
  undefined2 local_38;
  undefined2 local_36;
  byte local_34;
  byte local_33;
  
  bVar1 = DecimalType::GetScale(&source->type);
  bVar2 = DecimalType::GetWidth(&source->type);
  bVar3 = DecimalType::GetScale(&result->type);
  bVar4 = DecimalType::GetWidth(&result->type);
  uVar5 = (ulong)bVar4 + ((ulong)bVar1 - (ulong)bVar3);
  local_36 = *(undefined2 *)(NumericHelper::POWERS_OF_TEN + ((ulong)bVar1 - (ulong)bVar3) * 8);
  local_58 = result;
  local_50 = result;
  local_48 = parameters;
  if (bVar2 < uVar5) {
    local_40 = 1;
    UnaryExecutor::GenericExecute<short,duckdb::hugeint_t,duckdb::DecimalScaleDownOperator>
              (source,result,count,&local_58,false);
    local_40 = 1;
  }
  else {
    local_38 = *(undefined2 *)(NumericHelper::POWERS_OF_TEN + uVar5 * 8);
    local_40 = 1;
    local_34 = bVar2;
    local_33 = bVar1;
    UnaryExecutor::GenericExecute<short,duckdb::hugeint_t,duckdb::DecimalScaleDownCheckOperator>
              (source,result,count,&local_58,parameters->error_message != (string *)0x0);
  }
  return (bool)local_40;
}

Assistant:

bool TemplatedDecimalScaleDown(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto source_width = DecimalType::GetWidth(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	auto result_width = DecimalType::GetWidth(result.GetType());
	D_ASSERT(result_scale < source_scale);
	idx_t scale_difference = source_scale - result_scale;
	idx_t target_width = result_width + scale_difference;
	auto divide_factor = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[scale_difference]);
	if (source_width < target_width) {
		DecimalScaleInput<SOURCE> input(result, divide_factor, parameters);
		// type will always fit: no need to check limit
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleDownOperator>(source, result, count, &input);
		return true;
	} else {
		// type might not fit: check limit
		auto limit = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[target_width]);
		DecimalScaleInput<SOURCE> input(result, limit, divide_factor, parameters, source_width, source_scale);
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleDownCheckOperator>(source, result, count, &input,
		                                                                           parameters.error_message);
		return input.vector_cast_data.all_converted;
	}
}